

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::enterModal
          (QGraphicsScenePrivate *this,QGraphicsItem *panel,PanelModality previousModality)

{
  bool bVar1;
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItem **ppQVar3;
  const_iterator o;
  PanelModality in_EDX;
  long in_RSI;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem **item_2;
  QList<QGraphicsItem_*> *__range1_1;
  QGraphicsItem *item_1;
  QGraphicsItem **item;
  QList<QGraphicsItem_*> *__range1;
  PanelModality panelModality;
  QGraphicsScene *q;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QList<QGraphicsItem_*> items_;
  QEvent windowUnblockedEvent;
  QEvent windowBlockedEvent;
  QGraphicsSceneHoverEvent hoverEvent;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items__1;
  QSet<QGraphicsItem_*> blockedPanels;
  PanelModality in_stack_fffffffffffffee8;
  PanelModality PVar4;
  PanelModality in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef8;
  Type type;
  QGraphicsSceneHoverEvent *in_stack_ffffffffffffff00;
  SortOrder order;
  QGraphicsItem *in_stack_ffffffffffffff08;
  QGraphicsItem *in_stack_ffffffffffffff10;
  QGraphicsScenePrivate *this_01;
  undefined4 in_stack_ffffffffffffff20;
  PanelModality PVar5;
  const_iterator local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  QGraphicsItem *in_stack_ffffffffffffff68;
  QGraphicsSceneHoverEvent *in_stack_ffffffffffffff70;
  QGraphicsScenePrivate *in_stack_ffffffffffffff78;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QGraphicsItem **local_48;
  const_iterator local_40;
  const_iterator local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  this_00 = (QGraphicsItem *)q_func(in_RDI);
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(local_10 + 8));
  PVar4 = pQVar2->panelModality;
  if (in_EDX != NonModal) {
    in_stack_fffffffffffffeec = in_EDX;
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(local_10 + 8));
    pQVar2->panelModality = in_stack_fffffffffffffeec;
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QGraphicsItem_*>::QSet((QSet<QGraphicsItem_*> *)0x9cc7f2);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsScene::items
            ((QGraphicsScene *)in_stack_ffffffffffffff08,
             (SortOrder)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  this_01 = (QGraphicsScenePrivate *)&local_30;
  local_38.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
  local_40.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
  while( true ) {
    local_48 = local_40.i;
    bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_38,local_40);
    type = (Type)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    if (!bVar1) break;
    in_stack_ffffffffffffff10 =
         (QGraphicsItem *)QList<QGraphicsItem_*>::const_iterator::operator*(&local_38);
    bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9cc8ed);
    if ((bVar1) &&
       (bVar1 = QGraphicsItem::isBlockedByModalPanel
                          (this_00,(QGraphicsItem **)CONCAT44(PVar4,in_stack_ffffffffffffff20)),
       bVar1)) {
      QSet<QGraphicsItem_*>::insert
                ((QSet<QGraphicsItem_*> *)in_stack_ffffffffffffff08,
                 (QGraphicsItem **)in_stack_ffffffffffffff00);
    }
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_38);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9cc945);
  PVar5 = PVar4;
  if (in_EDX != NonModal) {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(local_10 + 8));
    pQVar2->panelModality = PVar4;
    QList<QGraphicsItem*>::removeAll<QGraphicsItem*>
              ((QList<QGraphicsItem_*> *)in_RDI,
               (QGraphicsItem **)CONCAT44(in_stack_fffffffffffffeec,PVar4));
    in_stack_fffffffffffffee8 = PVar4;
  }
  QList<QGraphicsItem_*>::prepend
            ((QList<QGraphicsItem_*> *)0x9cc99f,
             (parameter_type)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9cc9b0);
  if (!bVar1) {
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent(in_stack_ffffffffffffff00,type);
    QGraphicsSceneHoverEvent::setScenePos
              ((QGraphicsSceneHoverEvent *)in_RDI,
               (QPointF *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    dispatchHoverEvent(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    QGraphicsSceneHoverEvent::~QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)0x9cca28);
  }
  order = (SortOrder)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9cca39);
  if ((!bVar1) && ((*(uint *)&in_RDI->field_0xb8 >> 0xb & 1) != 0)) {
    ppQVar3 = QList<QGraphicsItem_*>::constLast
                        ((QList<QGraphicsItem_*> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    in_stack_ffffffffffffff08 = *ppQVar3;
    bVar1 = QGraphicsItem::isBlockedByModalPanel
                      (this_00,(QGraphicsItem **)CONCAT44(PVar5,in_stack_ffffffffffffff20));
    if (bVar1) {
      ungrabMouse((QGraphicsScenePrivate *)CONCAT44(PVar5,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff68,SUB81((ulong)this_01 >> 0x38,0));
    }
  }
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_80,WindowBlocked);
  QEvent::QEvent((QEvent *)&stack0xffffffffffffff70,WindowUnblocked);
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsScene::items((QGraphicsScene *)in_stack_ffffffffffffff08,order);
  local_b0.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_b0 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
  o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
  while (bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_b0,o), bVar1) {
    QList<QGraphicsItem_*>::const_iterator::operator*(&local_b0);
    bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9ccbca);
    if (bVar1) {
      bVar1 = QSet<QGraphicsItem_*>::contains
                        ((QSet<QGraphicsItem_*> *)in_RDI,
                         (QGraphicsItem **)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if ((bVar1) ||
         (bVar1 = QGraphicsItem::isBlockedByModalPanel
                            (this_00,(QGraphicsItem **)CONCAT44(PVar5,in_stack_ffffffffffffff20)),
         !bVar1)) {
        bVar1 = QSet<QGraphicsItem_*>::contains
                          ((QSet<QGraphicsItem_*> *)in_RDI,
                           (QGraphicsItem **)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if ((bVar1) &&
           (bVar1 = QGraphicsItem::isBlockedByModalPanel
                              (this_00,(QGraphicsItem **)CONCAT44(PVar5,in_stack_ffffffffffffff20)),
           !bVar1)) {
          sendEvent(this_01,in_stack_ffffffffffffff10,(QEvent *)in_stack_ffffffffffffff08);
        }
      }
      else {
        sendEvent(this_01,in_stack_ffffffffffffff10,(QEvent *)in_stack_ffffffffffffff08);
      }
    }
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_b0);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9ccc82);
  QEvent::~QEvent((QEvent *)&stack0xffffffffffffff70);
  QEvent::~QEvent((QEvent *)&local_80);
  QSet<QGraphicsItem_*>::~QSet((QSet<QGraphicsItem_*> *)0x9ccca9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::enterModal(QGraphicsItem *panel, QGraphicsItem::PanelModality previousModality)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(panel && panel->isPanel());

    QGraphicsItem::PanelModality panelModality = panel->d_ptr->panelModality;
    if (previousModality != QGraphicsItem::NonModal) {
        // the panel is changing from one modality type to another... temporarily set it back so
        // that blockedPanels is populated correctly
        panel->d_ptr->panelModality = previousModality;
    }

    QSet<QGraphicsItem *> blockedPanels;
    {
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && item->isBlockedByModalPanel())
                blockedPanels.insert(item);
        }
    }
    // blockedPanels contains all currently blocked panels

    if (previousModality != QGraphicsItem::NonModal) {
        // reset the modality to the proper value, since we changed it above
        panel->d_ptr->panelModality = panelModality;
        // remove this panel so that it will be reinserted at the front of the stack
        modalPanels.removeAll(panel);
    }

    modalPanels.prepend(panel);

    if (!hoverItems.isEmpty()) {
        // send GraphicsSceneHoverLeave events to newly blocked hoverItems
        QGraphicsSceneHoverEvent hoverEvent;
        hoverEvent.setScenePos(lastSceneMousePos);
        dispatchHoverEvent(&hoverEvent);
    }

    if (!mouseGrabberItems.isEmpty() && lastMouseGrabberItemHasImplicitMouseGrab) {
        QGraphicsItem *item = mouseGrabberItems.constLast();
        if (item->isBlockedByModalPanel())
            ungrabMouse(item, /*itemIsDying =*/ false);
    }

    QEvent windowBlockedEvent(QEvent::WindowBlocked);
    QEvent windowUnblockedEvent(QEvent::WindowUnblocked);
    const auto items_ = q->items();
    for (const auto &item : items_) {
        if (item->isPanel()) {
            if (!blockedPanels.contains(item) && item->isBlockedByModalPanel()) {
                // send QEvent::WindowBlocked to newly blocked panels
                sendEvent(item, &windowBlockedEvent);
            } else if (blockedPanels.contains(item) && !item->isBlockedByModalPanel()) {
                // send QEvent::WindowUnblocked to unblocked panels when downgrading
                // a panel from SceneModal to PanelModal
                sendEvent(item, &windowUnblockedEvent);
            }
        }
    }
}